

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O3

bool script_segwit_tests::anon_unknown_20::IsExpectedWitnessProgram
               (CScript *script,int expectedVersion,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *expectedProgram)

{
  pointer __s2;
  bool bVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  bool bVar5;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar6;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> actualProgram;
  int actualVersion;
  int expectedVersion_local;
  int *local_b0;
  assertion_result local_a8;
  int **local_90;
  int *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  lazy_ostream *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expectedVersion_local = expectedVersion;
  bVar1 = CScript::IsWitnessProgram(script,&actualVersion,&actualProgram);
  if (bVar1) {
    local_e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_e0 = "";
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x4f;
    file.m_begin = (iterator)&local_e8;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
    local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
    local_118._0_8_ = &PTR__lazy_ostream_01388f08;
    local_108 = boost::unit_test::lazy_ostream::inst;
    local_100 = "";
    local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(actualVersion == expectedVersion);
    local_50.m_message.px = (element_type *)0x0;
    local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_58 = "";
    local_68 = (lazy_ostream *)&local_88;
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_b0 = &expectedVersion_local;
    local_90 = &local_b0;
    local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
    local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
    local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    pvVar3 = (iterator)0x1;
    pvVar4 = (iterator)0x2;
    local_88 = &actualVersion;
    boost::test_tools::tt_detail::report_assertion
              (&local_50,(lazy_ostream *)local_118,1,2,REQUIRE,0xea430f,(size_t)&local_60,0x4f,
               &local_80,"expectedVersion",&local_a8);
    boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
    local_128 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_120 = "";
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar6 = 0x5a7aca;
    file_00.m_end = &DAT_00000050;
    file_00.m_begin = (iterator)&local_128;
    msg_00.m_end = pvVar4;
    msg_00.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_138,
               msg_00);
    __s2 = (expectedProgram->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
    if ((long)actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start ==
        (long)(expectedProgram->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
      if (actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar5 = true;
      }
      else {
        _cVar6 = 0x5a7b04;
        iVar2 = bcmp(actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start,__s2,
                     (long)actualProgram.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)actualProgram.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar5;
    local_a8.m_message.px = (element_type *)0x0;
    local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_118._0_8_ = "actualProgram == expectedProgram";
    local_118._8_8_ = "";
    local_80.m_empty = false;
    local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
    local_70 = boost::unit_test::lazy_ostream::inst;
    local_148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_segwit_tests.cpp"
    ;
    local_140 = "";
    local_68 = (lazy_ostream *)local_118;
    boost::test_tools::tt_detail::report_assertion
              (&local_a8,&local_80,1,0,WARN,_cVar6,(size_t)&local_148,0x50);
    boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  }
  if (actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(actualProgram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)actualProgram.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)actualProgram.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool IsExpectedWitnessProgram(const CScript& script, const int expectedVersion, const std::vector<unsigned char>& expectedProgram)
{
    int actualVersion;
    std::vector<unsigned char> actualProgram;
    if (!script.IsWitnessProgram(actualVersion, actualProgram)) {
        return false;
    }
    BOOST_CHECK_EQUAL(actualVersion, expectedVersion);
    BOOST_CHECK(actualProgram == expectedProgram);
    return true;
}